

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

Uint32 __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::CountFunctionArguments
          (ConversionStream *this,iterator *Token,iterator *ScopeEnd)

{
  bool bVar1;
  pointer pHVar2;
  Char *pCVar3;
  char (*in_RCX) [36];
  char (*Args_1) [39];
  undefined1 local_c8 [8];
  string msg_1;
  undefined1 local_88 [8];
  string err;
  anon_class_8_1_8696368e local_60;
  _List_node_base *local_58;
  Uint32 local_50 [2];
  Uint32 NumArguments;
  undefined1 local_40 [8];
  string msg;
  iterator *ScopeEnd_local;
  iterator *Token_local;
  ConversionStream *this_local;
  
  msg.field_2._8_8_ = ScopeEnd;
  pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if (pHVar2->Type != OpenParen) {
    FormatString<char[26],char[36]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::OpenParen",in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x68a);
    std::__cxx11::string::~string((string *)local_40);
  }
  local_50[0] = 0;
  local_58 = *(_List_node_base **)msg.field_2._8_8_;
  local_60.NumArguments = local_50;
  Args_1 = (char (*) [39])0x135;
  ProcessScope<Diligent::HLSL2GLSLConverterImpl::ConversionStream::CountFunctionArguments(std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>&,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>const&)::__0>
            (this,Token,(iterator)local_58,OpenParen,ClosingParen,&local_60);
  err.field_2._8_8_ =
       std::__cxx11::
       list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
       end(&this->m_Tokens);
  bVar1 = std::operator!=(Token,(_Self *)((long)&err.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[46]>
              ((string *)local_88,(char (*) [46])"Unexpected EOF while processing argument list");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
              ((String *)((long)&msg_1.field_2 + 8),this,Token,4);
    Args_1 = (char (*) [39])0x6a0;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               (char (*) [2])0xc39489,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&msg_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_88);
  }
  pHVar2 = std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator->(Token);
  if (pHVar2->Type != ClosingParen) {
    FormatString<char[26],char[39]>
              ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::ClosingParen",Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"CountFunctionArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x6a1);
    std::__cxx11::string::~string((string *)local_c8);
  }
  std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>::operator++(Token);
  return local_50[0];
}

Assistant:

Uint32 HLSL2GLSLConverterImpl::ConversionStream::CountFunctionArguments(TokenListType::iterator& Token, const TokenListType::iterator& ScopeEnd)
{
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                ^
    VERIFY_EXPR(Token->Type == TokenType::OpenParen);
    Uint32 NumArguments = 0;
    ProcessScope(
        Token, ScopeEnd, TokenType::OpenParen, TokenType::ClosingParen,
        [&](TokenListType::iterator& tkn, int ScopeDepth) {
            // Argument list is not empty, so there is at least one argument.
            if (NumArguments == 0)
                NumArguments = 1;
            // Number of additional arguments equals the number of commas
            // in scope depth 1

            // Do not count arguments of nested functions:
            // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
            //                                          ^
            //                                        ScopeDepth == 2
            if (ScopeDepth == 1 && tkn->Literal == ",")
                ++NumArguments;
            ++tkn;
        } //
    );
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                      ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF while processing argument list");
    VERIFY_EXPR(Token->Type == TokenType::ClosingParen);
    ++Token;
    // TestText.Sample( TestText_sampler, float2(0.0, 1.0)  );
    //                                                       ^
    return NumArguments;
}